

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::apply(QDockAreaLayout *this,bool animate)

{
  ulong uVar1;
  long in_RDI;
  QDockAreaLayout *in_stack_00000010;
  int i;
  QWidgetAnimator *widgetAnimator;
  bool in_stack_0000004f;
  undefined7 in_stack_00000050;
  bool in_stack_00000057;
  QRect *in_stack_00000058;
  QWidgetAnimator *in_stack_00000060;
  QWidget *in_stack_00000128;
  undefined4 local_1c;
  
  qt_mainwindow_layout((QMainWindow *)0x57bda8);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    QDockAreaLayoutInfo::apply
              ((QDockAreaLayoutInfo *)CONCAT17(in_stack_00000057,in_stack_00000050),
               in_stack_0000004f);
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    uVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x40))();
    if ((uVar1 & 1) == 0) {
      (**(code **)(**(long **)(in_RDI + 0x20) + 0x68))();
      QWidgetAnimator::animate
                (in_stack_00000060,in_stack_00000128,in_stack_00000058,in_stack_00000057);
    }
  }
  if (*(int *)(in_RDI + 0x200) == 1) {
    updateSeparatorWidgets(in_stack_00000010);
  }
  return;
}

Assistant:

void QDockAreaLayout::apply(bool animate)
{
    QWidgetAnimator &widgetAnimator = qt_mainwindow_layout(mainWindow)->widgetAnimator;

    for (int i = 0; i < QInternal::DockCount; ++i)
        docks[i].apply(animate);
    if (centralWidgetItem != nullptr && !centralWidgetItem->isEmpty()) {
        widgetAnimator.animate(centralWidgetItem->widget(), centralWidgetRect,
                                animate);
    }
#if QT_CONFIG(tabbar)
    if (sep == 1)
        updateSeparatorWidgets();
#endif // QT_CONFIG(tabbar)
}